

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20;
  Tuple3<pbrt::Vector3,_float> local_10;
  
  uVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar17._4_4_ = uVar2;
  auVar17._0_4_ = uVar1;
  auVar17._8_8_ = 0;
  local_30.z = (p->super_Tuple3<pbrt::Point3,_float>).z;
  lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = (long)this->triIndex;
  lVar5 = *(long *)(lVar3 + 8);
  lVar3 = *(long *)(lVar3 + 0x10);
  lVar6 = (long)*(int *)(lVar5 + lVar4 * 0xc);
  lVar7 = (long)*(int *)(lVar5 + 4 + lVar4 * 0xc);
  lVar5 = (long)*(int *)(lVar5 + 8 + lVar4 * 0xc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(lVar3 + lVar6 * 0xc);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(lVar3 + lVar7 * 0xc);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(lVar3 + lVar5 * 0xc);
  auVar11 = vsubps_avx(auVar11,auVar17);
  local_10.z = *(float *)(lVar3 + 8 + lVar6 * 0xc) - local_30.z;
  local_20.z = *(float *)(lVar3 + 8 + lVar7 * 0xc) - local_30.z;
  auVar18._0_4_ = auVar11._0_4_ * auVar11._0_4_;
  auVar18._4_4_ = auVar11._4_4_ * auVar11._4_4_;
  auVar18._8_4_ = auVar11._8_4_ * auVar11._8_4_;
  auVar18._12_4_ = auVar11._12_4_ * auVar11._12_4_;
  auVar10 = vmovshdup_avx(auVar18);
  auVar10 = vfmadd231ss_fma(auVar10,auVar11,auVar11);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_10.z),ZEXT416((uint)local_10.z));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar9 = auVar10._0_4_;
  auVar19._4_4_ = fVar9;
  auVar19._0_4_ = fVar9;
  auVar19._8_4_ = fVar9;
  auVar19._12_4_ = fVar9;
  local_10.z = local_10.z / fVar9;
  auVar10 = vdivps_avx(auVar11,auVar19);
  local_10._0_8_ = vmovlps_avx(auVar10);
  auVar11 = vsubps_avx(auVar14,auVar17);
  auVar12._0_4_ = auVar11._0_4_ * auVar11._0_4_;
  auVar12._4_4_ = auVar11._4_4_ * auVar11._4_4_;
  auVar12._8_4_ = auVar11._8_4_ * auVar11._8_4_;
  auVar12._12_4_ = auVar11._12_4_ * auVar11._12_4_;
  auVar10 = vmovshdup_avx(auVar12);
  auVar10 = vfmadd231ss_fma(auVar10,auVar11,auVar11);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_20.z),ZEXT416((uint)local_20.z));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar9 = auVar10._0_4_;
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar9;
  local_20.z = local_20.z / fVar9;
  auVar10 = vdivps_avx(auVar11,auVar15);
  local_20._0_8_ = vmovlps_avx(auVar10);
  auVar11 = vsubps_avx(auVar16,auVar17);
  local_30.z = *(float *)(lVar3 + 8 + lVar5 * 0xc) - local_30.z;
  auVar10._0_4_ = auVar11._0_4_ * auVar11._0_4_;
  auVar10._4_4_ = auVar11._4_4_ * auVar11._4_4_;
  auVar10._8_4_ = auVar11._8_4_ * auVar11._8_4_;
  auVar10._12_4_ = auVar11._12_4_ * auVar11._12_4_;
  auVar10 = vmovshdup_avx(auVar10);
  auVar10 = vfmadd231ss_fma(auVar10,auVar11,auVar11);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_30.z),ZEXT416((uint)local_30.z));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar9 = auVar10._0_4_;
  auVar13._4_4_ = fVar9;
  auVar13._0_4_ = fVar9;
  auVar13._8_4_ = fVar9;
  auVar13._12_4_ = fVar9;
  local_30.z = local_30.z / fVar9;
  auVar10 = vdivps_avx(auVar11,auVar13);
  local_30._0_8_ = vmovlps_avx(auVar10);
  FVar8 = SphericalTriangleArea((Vector3f *)&local_10,(Vector3f *)&local_20,(Vector3f *)&local_30);
  return FVar8;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }